

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

uint32 BailOutRecord::BailOutFromLoopBodyCommon
                 (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,
                 uint32 bailOutOffset,BailOutKind bailOutKind,Var branchValue)

{
  uint32 uVar1;
  ScriptContext *this;
  ThreadContext *this_00;
  Var *src;
  ScriptFunction *function;
  uint32 result;
  Var registerSaves [49];
  Var branchValue_local;
  BailOutKind bailOutKind_local;
  uint32 bailOutOffset_local;
  BailOutRecord *bailOutRecord_local;
  JavascriptCallStackLayout *layout_local;
  
  this = Js::RecyclableObject::GetScriptContext(*(RecyclableObject **)layout);
  this_00 = Js::ScriptContext::GetThreadContext(this);
  src = ThreadContext::GetBailOutRegisterSaveSpace(this_00);
  js_memcpy_s(&stack0xfffffffffffffe48,0x188,src,0x188);
  uVar1 = BailOutFromLoopBodyHelper
                    (layout,bailOutRecord,bailOutOffset,bailOutKind,branchValue,
                     (Var *)&stack0xfffffffffffffe48,(BailOutReturnValue *)0x0);
  function = Js::VarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  ScheduleLoopBodyCodeGen(function,(ScriptFunction *)0x0,bailOutRecord,bailOutKind);
  return uVar1;
}

Assistant:

uint32
BailOutRecord::BailOutFromLoopBodyCommon(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord, uint32 bailOutOffset,
    IR::BailOutKind bailOutKind, Js::Var branchValue)
{
    // This isn't strictly necessary if there's no allocations on this path, but because such an
    // issue would be hard to notice and introduce some significant issues, we can do this copy.
    // The problem from not doing this and then doing an allocation before RestoreValues is that
    // the GC doesn't check the BailOutRegisterSaveSpace.
    Js::Var registerSaves[BailOutRegisterSaveSlotCount];
    js_memcpy_s(registerSaves, sizeof(registerSaves), (Js::Var *)layout->functionObject->GetScriptContext()->GetThreadContext()->GetBailOutRegisterSaveSpace(),
        sizeof(registerSaves));
    uint32 result = BailOutFromLoopBodyHelper(layout, bailOutRecord, bailOutOffset, bailOutKind, branchValue, registerSaves);
    ScheduleLoopBodyCodeGen(Js::VarTo<Js::ScriptFunction>(layout->functionObject), nullptr, bailOutRecord, bailOutKind);
    return result;
}